

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtype.cpp
# Opt level: O0

uint __thiscall vm_val_t::calc_hash(vm_val_t *this,int depth)

{
  CVmObject *pCVar1;
  pool_ofs_t in_ESI;
  CVmPoolInMem *in_RDI;
  int unaff_retaddr;
  char *in_stack_00000008;
  undefined4 in_stack_00000010;
  uint local_4;
  
  switch(*(undefined4 *)&(in_RDI->super_CVmPoolPaged).super_CVmPool._vptr_CVmPool) {
  case 1:
    local_4 = 0;
    break;
  case 2:
    local_4 = 1;
    break;
  default:
    local_4 = 3;
    break;
  case 5:
    pCVar1 = vm_objp(0);
    local_4 = (*pCVar1->_vptr_CVmObject[0x21])
                        (pCVar1,(ulong)(uint)(in_RDI->super_CVmPoolPaged).super_CVmPool.page_size_,
                         (ulong)in_ESI);
    break;
  case 6:
    local_4 = (uint)(ushort)(in_RDI->super_CVmPoolPaged).super_CVmPool.page_size_;
    break;
  case 7:
  case 0x10:
  case 0x12:
    local_4 = (uint)(ushort)(in_RDI->super_CVmPoolPaged).super_CVmPool.page_size_ *
              (uint)*(ushort *)((long)&(in_RDI->super_CVmPoolPaged).super_CVmPool.page_size_ + 2) &
              0xffff;
    break;
  case 8:
    CVmPoolInMem::get_ptr(in_RDI,in_ESI);
    local_4 = CVmObjString::const_calc_hash((char *)in_RDI);
    break;
  case 10:
    CVmPoolInMem::get_ptr(in_RDI,in_ESI);
    local_4 = CVmObjList::const_calc_hash
                        ((vm_val_t *)CONCAT44(depth,in_stack_00000010),in_stack_00000008,
                         unaff_retaddr);
    break;
  case 0xb:
  case 0xc:
    local_4 = (uint)(in_RDI->super_CVmPoolPaged).super_CVmPool.page_size_ & 0xffff ^
              (uint)(in_RDI->super_CVmPoolPaged).super_CVmPool.page_size_ >> 0x10;
    break;
  case 0xd:
    local_4 = 2;
    break;
  case 0xf:
    local_4 = (uint)(in_RDI->super_CVmPoolPaged).super_CVmPool.page_size_ & 0xffff ^
              (uint)(in_RDI->super_CVmPoolPaged).super_CVmPool.page_size_ >> 0x10;
    break;
  case 0x11:
    local_4 = (uint)(in_RDI->super_CVmPoolPaged).super_CVmPool.page_size_ & 0xffff ^
              (uint)(in_RDI->super_CVmPoolPaged).super_CVmPool.page_size_ >> 0x10;
  }
  return local_4;
}

Assistant:

uint vm_val_t::calc_hash(VMG_ int depth) const
{
    /* see what we have */
    switch(typ)
    {
    case VM_NIL:
        /* this is rather arbitrary */
        return 0;
        
    case VM_TRUE:
        /* this is arbitrary, but at least make it different from nil */
        return 1;
        
    case VM_EMPTY:
        /* also arbitrary */
        return 2;
        
    case VM_CODEOFS:
    case VM_FUNCPTR:
        /* use a 16-bit hash of the code address */
        return (uint)((val.ofs & 0xffff)
                      ^ ((val.ofs & 0xffff0000) >> 16));

    case VM_OBJX:
        /* use a 16-bit hash of the object ID */
        return (uint)((val.obj & 0xffff)
                      ^ ((val.obj & 0xffff0000) >> 16));

    case VM_PROP:
        /* use the property ID as the hash */
        return (uint)val.prop;

    case VM_INT:
    case VM_BIFPTR:
    case VM_BIFPTRX:
        /* 
         *   the set index and function index both tend to be small integers;
         *   multiply them and keep the low-order 16 bits 
         */
        return (uint)(val.bifptr.set_idx * val.bifptr.func_idx) & 0xffff;

    case VM_ENUM:
        /* use a 16-bit hash of the enum value */
        return (uint)((val.enumval & 0xffff)
                      ^ ((val.enumval & 0xffff0000) >> 16));

    case VM_OBJ:
        /* ask the object to calculate its hash value */
        return vm_objp(vmg_ val.obj)->calc_hash(vmg_ val.obj, depth);
        break;

    case VM_SSTRING:
        /* get the hash of the constant string */
        return CVmObjString::
            const_calc_hash(G_const_pool->get_ptr(val.ofs));
        break;

    case VM_LIST:
        /* get the hash of the constant list */
        return CVmObjList::
            const_calc_hash(vmg_ this, G_const_pool->get_ptr(val.ofs), depth);

    default:
        /* return an arbitrary value for any other type */
        return 3;
    }
}